

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> * __thiscall
Catch::Generators::
makeGenerators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
          (Generators<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>
           *__return_storage_ptr__,Generators *this,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *val,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_1,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_2,
          pair<trng::portable_impl::uint128,_trng::portable_impl::uint128> *moreGenerators_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  pointer *__ptr;
  GeneratorWrapper<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_> local_38;
  
  local_38.m_generator._M_t.
  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
  .
  super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
        )operator_new(0x28);
  *(undefined ***)
   local_38.m_generator._M_t.
   super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   ._M_t.
   super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
   .
   super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
   ._M_head_impl = &PTR__GeneratorUntypedBase_00319720;
  lVar1 = *(long *)(this + 8);
  lVar2 = *(long *)(this + 0x10);
  lVar3 = *(long *)(this + 0x18);
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 8) = *(long *)this;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x10) = lVar1;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x18) = lVar2;
  *(long *)((long)local_38.m_generator._M_t.
                  super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                  .
                  super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                  ._M_head_impl + 0x20) = lVar3;
  Generators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>::
  Generators<Catch::Generators::GeneratorWrapper<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>,pair<trng::portable_impl::uint128,trng::portable_impl::uint128>>
            ((Generators<pair<trng::portable_impl::uint128,trng::portable_impl::uint128>> *)
             __return_storage_ptr__,&local_38,val,moreGenerators,moreGenerators_1,moreGenerators_2);
  if (local_38.m_generator._M_t.
      super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
      .
      super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)local_38.m_generator._M_t.
                          super___uniq_ptr_impl<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_std::default_delete<Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_>_>
                          .
                          super__Head_base<0UL,_Catch::Generators::IGenerator<pair<trng::portable_impl::uint128,_trng::portable_impl::uint128>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }